

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool ContextualCheckBlockHeader
               (CBlockHeader *block,BlockValidationState *state,BlockManager *blockman,
               ChainstateManager *chainman,CBlockIndex *pindexPrev)

{
  uint uVar1;
  CChainParams *params;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  CBlockIndex *pCVar5;
  int64_t iVar6;
  ulong uVar7;
  time_point tVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  allocator<char> local_7e;
  allocator<char> local_7d;
  int nHeight;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexPrev == (CBlockIndex *)0x0) {
    __assert_fail("pindexPrev != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1039,
                  "bool ContextualCheckBlockHeader(const CBlockHeader &, BlockValidationState &, BlockManager &, const ChainstateManager &, const CBlockIndex *)"
                 );
  }
  lVar10 = (long)pindexPrev->nHeight + 1;
  iVar9 = (int)lVar10;
  params = (chainman->m_options).chainparams;
  uVar1 = block->nBits;
  nHeight = iVar9;
  uVar4 = GetNextWorkRequired(pindexPrev,block,&params->consensus);
  if (uVar1 == uVar4) {
    if ((chainman->m_options).checkpoints_enabled == true) {
      pCVar5 = node::BlockManager::GetLastCheckpoint
                         (blockman,&((chainman->m_options).chainparams)->checkpointData);
      if ((pCVar5 != (CBlockIndex *)0x0) && (iVar9 < pCVar5->nHeight)) {
        logging_function._M_str = "ContextualCheckBlockHeader";
        logging_function._M_len = 0x1a;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        LogPrintFormatInternal<char[27],int>
                  (logging_function,source_file,0x1048,ALL,Info,(ConstevalFormatString<2U>)0x6c7dc5,
                   (char (*) [27])"ContextualCheckBlockHeader",&nHeight);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"bad-fork-prior-to-checkpoint",&local_7d);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_7e);
        bVar2 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_CHECKPOINT,
                           &local_58,&local_78);
        goto LAB_00365c5f;
      }
    }
    uVar1 = block->nTime;
    iVar6 = CBlockIndex::GetMedianTimePast(pindexPrev);
    if (iVar6 < (long)(ulong)uVar1) {
      if ((params->consensus).enforce_BIP94 == false) {
        uVar7 = (ulong)block->nTime;
      }
      else {
        uVar7 = (ulong)block->nTime;
        if ((lVar10 % ((params->consensus).nPowTargetTimespan /
                      (params->consensus).nPowTargetSpacing) == 0) &&
           ((long)uVar7 < (long)((ulong)pindexPrev->nTime - 600))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"time-timewarp-attack",&local_7d);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"block\'s timestamp is too early on diff adjustment block",
                     &local_7e);
          bVar2 = ValidationState<BlockValidationResult>::Invalid
                            (&state->super_ValidationState<BlockValidationResult>,
                             BLOCK_INVALID_HEADER,&local_58,&local_78);
          goto LAB_00365c5f;
        }
      }
      tVar8 = NodeClock::now();
      if (uVar7 * 1000000000 - ((long)tVar8.__d.__r + 7200000000000) == 0 ||
          (long)(uVar7 * 1000000000) < (long)tVar8.__d.__r + 7200000000000) {
        iVar9 = block->nVersion;
        if (iVar9 < 2) {
          bVar2 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                            (pindexPrev,chainman,DEPLOYMENT_HEIGHTINCB);
          if (!bVar2) {
            iVar9 = block->nVersion;
            goto LAB_00365bdf;
          }
        }
        else {
LAB_00365bdf:
          if (iVar9 < 3) {
            bVar2 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                              (pindexPrev,chainman,DEPLOYMENT_DERSIG);
            if (bVar2) goto LAB_00365c1b;
            iVar9 = block->nVersion;
          }
          bVar2 = true;
          if (3 < iVar9) goto LAB_00365c75;
          bVar3 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                            (pindexPrev,chainman,DEPLOYMENT_CLTV);
          if (!bVar3) goto LAB_00365c75;
        }
LAB_00365c1b:
        tinyformat::format<int>(&local_58,"bad-version(0x%08x)",&block->nVersion);
        tinyformat::format<int>(&local_78,"rejected nVersion=0x%08x block",&block->nVersion);
        bVar2 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER
                           ,&local_58,&local_78);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"time-too-new",&local_7d);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"block timestamp too far in the future",&local_7e);
        bVar2 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_TIME_FUTURE,
                           &local_58,&local_78);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"time-too-old",&local_7d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"block\'s timestamp is too early",&local_7e);
      bVar2 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                         &local_58,&local_78);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"bad-diffbits",&local_7d)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"incorrect proof of work",&local_7e);
    bVar2 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                       &local_58,&local_78);
  }
LAB_00365c5f:
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
LAB_00365c75:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);
    assert(pindexPrev != nullptr);
    const int nHeight = pindexPrev->nHeight + 1;

    // Check proof of work
    const Consensus::Params& consensusParams = chainman.GetConsensus();
    if (block.nBits != GetNextWorkRequired(pindexPrev, &block, consensusParams))
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "bad-diffbits", "incorrect proof of work");

    // Check against checkpoints
    if (chainman.m_options.checkpoints_enabled) {
        // Don't accept any forks from the main chain prior to last checkpoint.
        // GetLastCheckpoint finds the last checkpoint in MapCheckpoints that's in our
        // BlockIndex().
        const CBlockIndex* pcheckpoint = blockman.GetLastCheckpoint(chainman.GetParams().Checkpoints());
        if (pcheckpoint && nHeight < pcheckpoint->nHeight) {
            LogPrintf("ERROR: %s: forked chain older than last checkpoint (height %d)\n", __func__, nHeight);
            return state.Invalid(BlockValidationResult::BLOCK_CHECKPOINT, "bad-fork-prior-to-checkpoint");
        }
    }

    // Check timestamp against prev
    if (block.GetBlockTime() <= pindexPrev->GetMedianTimePast())
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-too-old", "block's timestamp is too early");

    // Testnet4 and regtest only: Check timestamp against prev for difficulty-adjustment
    // blocks to prevent timewarp attacks (see https://github.com/bitcoin/bitcoin/pull/15482).
    if (consensusParams.enforce_BIP94) {
        // Check timestamp for the first block of each difficulty adjustment
        // interval, except the genesis block.
        if (nHeight % consensusParams.DifficultyAdjustmentInterval() == 0) {
            if (block.GetBlockTime() < pindexPrev->GetBlockTime() - MAX_TIMEWARP) {
                return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-timewarp-attack", "block's timestamp is too early on diff adjustment block");
            }
        }
    }

    // Check timestamp
    if (block.Time() > NodeClock::now() + std::chrono::seconds{MAX_FUTURE_BLOCK_TIME}) {
        return state.Invalid(BlockValidationResult::BLOCK_TIME_FUTURE, "time-too-new", "block timestamp too far in the future");
    }

    // Reject blocks with outdated version
    if ((block.nVersion < 2 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB)) ||
        (block.nVersion < 3 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_DERSIG)) ||
        (block.nVersion < 4 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CLTV))) {
            return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, strprintf("bad-version(0x%08x)", block.nVersion),
                                 strprintf("rejected nVersion=0x%08x block", block.nVersion));
    }

    return true;
}